

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O0

bool __thiscall FsmMachineClass::operator<(FsmMachineClass *this,FsmMachineClass *fsmc)

{
  value_type vVar1;
  ushort uVar2;
  size_type_conflict sVar3;
  size_type_conflict sVar4;
  const_reference pvVar5;
  long in_RSI;
  long in_RDI;
  size_t iw;
  ulong local_20;
  bool local_1;
  
  if (in_RDI == in_RSI) {
    local_1 = false;
  }
  else {
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x38));
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RSI + 0x38));
    if (sVar3 == sVar4) {
      for (local_20 = 0;
          sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             (in_RDI + 0x38)), local_20 < sVar3; local_20 = local_20 + 1) {
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + 0x38),local_20);
        vVar1 = *pvVar5;
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RSI + 0x38),local_20);
        if (vVar1 != *pvVar5) {
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RDI + 0x38),local_20);
          uVar2 = *pvVar5;
          pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                              (in_RSI + 0x38),local_20);
          return uVar2 < *pvVar5;
        }
      }
      local_1 = false;
    }
    else {
      sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x38))
      ;
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RSI + 0x38))
      ;
      local_1 = sVar3 < sVar4;
    }
  }
  return local_1;
}

Assistant:

bool operator<(const FsmMachineClass & fsmc) const
	{
		if (this == &fsmc)
			return false; // equal, not less than
		if (this->m_wGlyphs.size() != fsmc.m_wGlyphs.size())
			return (this->m_wGlyphs.size() < fsmc.m_wGlyphs.size());
		for (size_t iw = 0; iw < m_wGlyphs.size(); iw++)
		{
			if (this->m_wGlyphs[iw] != fsmc.m_wGlyphs[iw])
				return (this->m_wGlyphs[iw] < fsmc.m_wGlyphs[iw]);
		}
		return false; // equal, not less than
	}